

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_huffman.cpp
# Opt level: O3

void unpad_tree_uint(HuffmanTree *huffmanTree,uint *L,uint *R,uint *C,uchar *t,uint i,node root)

{
  uchar uVar1;
  uint i_00;
  int iVar2;
  node_t *pnVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)i;
  uVar1 = root->t;
  while( true ) {
    if (uVar1 != '\0') {
      return;
    }
    i_00 = L[uVar4];
    uVar5 = (ulong)i_00;
    if (uVar5 != 0) {
      uVar1 = t[uVar5];
      pnVar3 = huffmanTree->pool;
      iVar2 = huffmanTree->n_nodes;
      pnVar3[iVar2].c = C[uVar5];
      pnVar3[iVar2].t = uVar1;
      huffmanTree->n_nodes = iVar2 + 1;
      root->left = pnVar3 + iVar2;
      unpad_tree_uint(huffmanTree,L,R,C,t,i_00,pnVar3 + iVar2);
    }
    uVar4 = (ulong)R[uVar4];
    if (uVar4 == 0) break;
    uVar1 = t[uVar4];
    pnVar3 = huffmanTree->pool;
    iVar2 = huffmanTree->n_nodes;
    pnVar3[iVar2].c = C[uVar4];
    pnVar3[iVar2].t = uVar1;
    huffmanTree->n_nodes = iVar2 + 1;
    root->right = pnVar3 + iVar2;
    root = pnVar3 + iVar2;
  }
  return;
}

Assistant:

void unpad_tree_uint(HuffmanTree* huffmanTree, unsigned int* L, unsigned int* R, unsigned int* C, unsigned char* t, unsigned int i, node root)
{
	//root->c = C[i];
	if(root->t==0)
	{
		unsigned int l, r;
		l = L[i];
		if(l!=0)
		{
			node lroot = new_node2(huffmanTree,C[l],t[l]);
			root->left = lroot;
			unpad_tree_uint(huffmanTree,L,R,C,t,l,lroot);
		}
		r = R[i];
		if(r!=0)
		{
			node rroot = new_node2(huffmanTree,C[r],t[r]);
			root->right = rroot;
			unpad_tree_uint(huffmanTree,L,R,C,t,r,rroot);
		}
	}
}